

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shanten.cpp
# Opt level: O1

int mahjong::thirteen_orphans_shanten
              (tile_t *standing_tiles,intptr_t standing_cnt,useful_table_t *useful_table)

{
  short sVar1;
  int i_1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  intptr_t i;
  long lVar5;
  tile_table_t cnt_table;
  short asStack_a8 [72];
  
  iVar2 = 0x7fffffff;
  if (standing_cnt == 0xd && standing_tiles != (tile_t *)0x0) {
    lVar5 = 0;
    memset(asStack_a8,0,0x90);
    do {
      asStack_a8[standing_tiles[lVar5]] = asStack_a8[standing_tiles[lVar5]] + 1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0xd);
    lVar5 = 0;
    uVar3 = 0;
    iVar2 = 0;
    do {
      sVar1 = asStack_a8[(byte)(&standard_thirteen_orphans)[lVar5]];
      uVar4 = 1;
      if (sVar1 == 1) {
        uVar4 = uVar3;
      }
      if (sVar1 == 0) {
        uVar4 = uVar3;
      }
      uVar3 = uVar4;
      iVar2 = iVar2 + (uint)(sVar1 != 0);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0xd);
    if (useful_table != (useful_table_t *)0x0) {
      *(bool *)((long)useful_table + 0x30) = false;
      *(bool *)((long)useful_table + 0x31) = false;
      *(bool *)((long)useful_table + 0x32) = false;
      *(bool *)((long)useful_table + 0x33) = false;
      *(bool *)((long)useful_table + 0x34) = false;
      *(bool *)((long)useful_table + 0x35) = false;
      *(bool *)((long)useful_table + 0x36) = false;
      *(bool *)((long)useful_table + 0x37) = false;
      *(bool *)((long)useful_table + 0x38) = false;
      *(bool *)((long)useful_table + 0x39) = false;
      *(bool *)((long)useful_table + 0x3a) = false;
      *(bool *)((long)useful_table + 0x3b) = false;
      *(bool *)((long)useful_table + 0x3c) = false;
      *(bool *)((long)useful_table + 0x3d) = false;
      *(bool *)((long)useful_table + 0x3e) = false;
      *(bool *)((long)useful_table + 0x3f) = false;
      *(bool *)((long)useful_table + 0x20) = false;
      *(bool *)((long)useful_table + 0x21) = false;
      *(bool *)((long)useful_table + 0x22) = false;
      *(bool *)((long)useful_table + 0x23) = false;
      *(bool *)((long)useful_table + 0x24) = false;
      *(bool *)((long)useful_table + 0x25) = false;
      *(bool *)((long)useful_table + 0x26) = false;
      *(bool *)((long)useful_table + 0x27) = false;
      *(bool *)((long)useful_table + 0x28) = false;
      *(bool *)((long)useful_table + 0x29) = false;
      *(bool *)((long)useful_table + 0x2a) = false;
      *(bool *)((long)useful_table + 0x2b) = false;
      *(bool *)((long)useful_table + 0x2c) = false;
      *(bool *)((long)useful_table + 0x2d) = false;
      *(bool *)((long)useful_table + 0x2e) = false;
      *(bool *)((long)useful_table + 0x2f) = false;
      *(bool *)((long)useful_table + 0x10) = false;
      *(bool *)((long)useful_table + 0x11) = false;
      *(bool *)((long)useful_table + 0x12) = false;
      *(bool *)((long)useful_table + 0x13) = false;
      *(bool *)((long)useful_table + 0x14) = false;
      *(bool *)((long)useful_table + 0x15) = false;
      *(bool *)((long)useful_table + 0x16) = false;
      *(bool *)((long)useful_table + 0x17) = false;
      *(bool *)((long)useful_table + 0x18) = false;
      *(bool *)((long)useful_table + 0x19) = false;
      *(bool *)((long)useful_table + 0x1a) = false;
      *(bool *)((long)useful_table + 0x1b) = false;
      *(bool *)((long)useful_table + 0x1c) = false;
      *(bool *)((long)useful_table + 0x1d) = false;
      *(bool *)((long)useful_table + 0x1e) = false;
      *(bool *)((long)useful_table + 0x1f) = false;
      *(bool *)((long)useful_table + 0) = false;
      *(bool *)((long)useful_table + 1) = false;
      *(bool *)((long)useful_table + 2) = false;
      *(bool *)((long)useful_table + 3) = false;
      *(bool *)((long)useful_table + 4) = false;
      *(bool *)((long)useful_table + 5) = false;
      *(bool *)((long)useful_table + 6) = false;
      *(bool *)((long)useful_table + 7) = false;
      *(bool *)((long)useful_table + 8) = false;
      *(bool *)((long)useful_table + 9) = false;
      *(bool *)((long)useful_table + 10) = false;
      *(bool *)((long)useful_table + 0xb) = false;
      *(bool *)((long)useful_table + 0xc) = false;
      *(bool *)((long)useful_table + 0xd) = false;
      *(bool *)((long)useful_table + 0xe) = false;
      *(bool *)((long)useful_table + 0xf) = false;
      *(bool *)((long)useful_table + 0x40) = false;
      *(bool *)((long)useful_table + 0x41) = false;
      *(bool *)((long)useful_table + 0x42) = false;
      *(bool *)((long)useful_table + 0x43) = false;
      *(bool *)((long)useful_table + 0x44) = false;
      *(bool *)((long)useful_table + 0x45) = false;
      *(bool *)((long)useful_table + 0x46) = false;
      *(bool *)((long)useful_table + 0x47) = false;
      lVar5 = 0;
      do {
        (*useful_table)[(byte)(&standard_thirteen_orphans)[lVar5]] = true;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0xd);
      if (uVar3 != 0) {
        lVar5 = 0;
        do {
          if (asStack_a8[(byte)(&standard_thirteen_orphans)[lVar5]] != 0) {
            (*useful_table)[(byte)(&standard_thirteen_orphans)[lVar5]] = false;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0xd);
      }
    }
    iVar2 = (uVar3 ^ 0xd) - iVar2;
  }
  return iVar2;
}

Assistant:

int thirteen_orphans_shanten(const tile_t *standing_tiles, intptr_t standing_cnt, useful_table_t *useful_table) {
    if (standing_tiles == nullptr || standing_cnt != 13) {
        return std::numeric_limits<int>::max();
    }

    // 对牌的种类进行打表
    tile_table_t cnt_table;
    map_tiles(standing_tiles, standing_cnt, &cnt_table);

    bool has_pair = false;
    int cnt = 0;
    for (int i = 0; i < 13; ++i) {
        int n = cnt_table[standard_thirteen_orphans[i]];
        if (n > 0) {
            ++cnt;  // 幺九牌的种类
            if (n > 1) {
                has_pair = true;  // 幺九牌对子
            }
        }
    }

    // 当有对子时，上听数为：12-幺九牌的种类
    // 当没有对子时，上听数为：13-幺九牌的种类
    int ret = has_pair ? 12 - cnt : 13 - cnt;

    if (useful_table != nullptr) {
        // 先标记所有的幺九牌为有效牌
        memset(*useful_table, 0, sizeof(*useful_table));
        std::for_each(std::begin(standard_thirteen_orphans), std::end(standard_thirteen_orphans),
            [useful_table](tile_t t) {
            (*useful_table)[t] = true;
        });

        // 当有对子时，已有的幺九牌都不需要了
        if (has_pair) {
            for (int i = 0; i < 13; ++i) {
                tile_t t = standard_thirteen_orphans[i];
                int n = cnt_table[t];
                if (n > 0) {
                    (*useful_table)[t] = false;
                }
            }
        }
    }

    return ret;
}